

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

int sha3_done(hash_state *md,uchar *hash)

{
  ulong *puVar1;
  long lVar2;
  
  if (md == (hash_state *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0xec)
    ;
  }
  if (hash == (uchar *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0xed)
    ;
  }
  *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) =
       *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) ^ (md->chc).length ^
       6L << ((ulong)(byte)(md->dummy[0x198] << 3) & 0x3f);
  puVar1 = (ulong *)((long)md + (0x18 - (ulong)(md->sha3).capacity_words) * 8 + 8);
  *puVar1 = *puVar1 ^ 0x8000000000000000;
  keccakf((md->whirlpool).state);
  for (lVar2 = -200; lVar2 != 0; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)md + lVar2 + 0x198) = *(undefined8 *)(md->dummy + 0xd0 + lVar2);
  }
  memcpy(hash,md->dummy + 0xd0,(ulong)(md->sha3).capacity_words << 2);
  return 0;
}

Assistant:

int sha3_done(hash_state *md, unsigned char *hash)
{
   unsigned i;

   LTC_ARGCHK(md   != NULL);
   LTC_ARGCHK(hash != NULL);

   md->sha3.s[md->sha3.word_index] ^= (md->sha3.saved ^ (CONST64(0x06) << (md->sha3.byte_index * 8)));
   md->sha3.s[SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words - 1] ^= CONST64(0x8000000000000000);
   keccakf(md->sha3.s);

   /* store sha3.s[] as little-endian bytes into sha3.sb */
   for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
      STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
   }

   XMEMCPY(hash, md->sha3.sb, md->sha3.capacity_words * 4);
   return CRYPT_OK;
}